

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakelibraryinfo.cpp
# Opt level: O2

void QMakeLibraryInfo::sysrootify(QString *path)

{
  char16_t cVar1;
  char16_t *pcVar2;
  char cVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  anon_union_24_3_e3d07ef4_for_data local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  rawLocation((QString *)&local_60,0x15,FinalPaths);
  QVariant::fromValue<QString,_true>
            ((enable_if_t<std::conjunction_v<std::is_copy_constructible<QString>,_std::is_destructible<QString>_>,_QVariant>
              *)&local_48,(QString *)&local_60);
  cVar3 = QVariant::toBool();
  QVariant::~QVariant((QVariant *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  if (cVar3 != '\0') {
    local_48._16_8_ = -0x5555555555555556;
    local_48.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
    local_48._8_8_ = 0xaaaaaaaaaaaaaaaa;
    rawLocation((QString *)&local_48,0x14,FinalPaths);
    if (local_48._16_8_ != 0) {
      if ((((ulong)(path->d).size < 3) || (pcVar2 = (path->d).ptr, pcVar2[1] != L':')) ||
         ((cVar1 = pcVar2[2], cVar1 != L'\\' && (cVar1 != L'/')))) {
        QString::prepend(path,(QString *)&local_48);
      }
      else {
        QString::replace((longlong)path,0,(QString *)0x2);
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeLibraryInfo::sysrootify(QString &path)
{
    // Acceptable values for SysrootifyPrefixPath are "true" and "false"
    if (!QVariant::fromValue(rawLocation(SysrootifyPrefixPath, FinalPaths)).toBool())
        return;

    const QString sysroot = rawLocation(SysrootPath, FinalPaths);
    if (sysroot.isEmpty())
        return;

    if (path.size() > 2 && path.at(1) == QLatin1Char(':')
        && (path.at(2) == QLatin1Char('/') || path.at(2) == QLatin1Char('\\'))) {
        path.replace(0, 2, sysroot); // Strip out the drive on Windows targets
    } else {
        path.prepend(sysroot);
    }
}